

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall Fl_Preferences::RootNode::~RootNode(RootNode *this)

{
  Node *this_00;
  char cVar1;
  size_t in_RCX;
  void *__buf;
  int in_ESI;
  
  cVar1 = Node::dirty(this->prefs_->node);
  if (cVar1 != '\0') {
    write(this,in_ESI,__buf,in_RCX);
  }
  if (this->filename_ != (char *)0x0) {
    free(this->filename_);
    this->filename_ = (char *)0x0;
  }
  if (this->vendor_ != (char *)0x0) {
    free(this->vendor_);
    this->vendor_ = (char *)0x0;
  }
  if (this->application_ != (char *)0x0) {
    free(this->application_);
    this->application_ = (char *)0x0;
  }
  this_00 = this->prefs_->node;
  if (this_00 != (Node *)0x0) {
    Node::~Node(this_00);
  }
  operator_delete(this_00,0x48);
  this->prefs_->node = (Node *)0x0;
  return;
}

Assistant:

Fl_Preferences::RootNode::~RootNode() {
  if ( prefs_->node->dirty() )
    write();
  if ( filename_ ) {
    free( filename_ );
    filename_ = 0L;
  }
  if ( vendor_ ) {
    free( vendor_ );
    vendor_ = 0L;
  }
  if ( application_ ) {
    free( application_ );
    application_ = 0L;
  }
  delete prefs_->node;
  prefs_->node = 0L;
}